

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O3

bool __thiscall gui::MultilineTextBox::handleKeyPressed(MultilineTextBox *this,KeyEvent *key)

{
  Vector2<unsigned_long> *pVVar1;
  Key KVar2;
  pointer pSVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  Uint32 UVar8;
  size_t sVar9;
  Iterator IVar10;
  Iterator IVar11;
  size_t sVar12;
  pair<sf::Vector2<unsigned_long>,_bool> *ppVar13;
  pair<sf::Vector2<unsigned_long>,_bool> *ppVar14;
  undefined1 continueSelection;
  int delta;
  unsigned_long uVar15;
  Vector2<unsigned_long> *pVVar16;
  Vector2<unsigned_long> *pVVar17;
  const_iterator __end1_2;
  uint32_t unicode;
  byte bVar18;
  const_iterator __end1_1;
  long lVar19;
  pointer pSVar20;
  const_iterator __end1;
  const_iterator __begin1_1;
  const_iterator __begin1;
  String *pSVar21;
  ulong uVar22;
  String local_68;
  Vector2<unsigned_long> local_40;
  
  pVVar16 = (Vector2<unsigned_long> *)&local_68;
  pVVar17 = (Vector2<unsigned_long> *)&local_68;
  bVar6 = Widget::handleKeyPressed(&this->super_Widget,key);
  sVar9 = findCaretOffset(this,&this->caretPosition_);
  KVar2 = key->code;
  if (key->control == true) {
    if (KVar2 < X) {
      if (KVar2 != A) {
        if (KVar2 == C) {
          if ((this->selectionStart_).second != true) {
            return true;
          }
          handleKeyPressed::anon_class_8_1_8991fb9c::operator()
                    (&local_68,(anon_class_8_1_8991fb9c *)this);
          sf::Clipboard::setString(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
               *)local_68.m_string._M_dataplus._M_p == &local_68.m_string.field_2) {
            return true;
          }
          operator_delete(local_68.m_string._M_dataplus._M_p);
          return true;
        }
        if (KVar2 != V) {
          return bVar6;
        }
        sf::Clipboard::getString();
        IVar10 = sf::String::begin_abi_cxx11_(&local_68);
        IVar11 = sf::String::end_abi_cxx11_(&local_68);
        bVar18 = 0;
        for (; IVar10._M_current != IVar11._M_current; IVar10._M_current = IVar10._M_current + 1) {
          bVar6 = insertCharacter(this,*IVar10._M_current,true);
          bVar18 = bVar18 | bVar6;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
             *)local_68.m_string._M_dataplus._M_p != &local_68.m_string.field_2) {
          operator_delete(local_68.m_string._M_dataplus._M_p);
        }
        if (bVar18 == 0) {
          return true;
        }
        pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar19 = 0;
        for (pSVar20 = (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar20 != pSVar3; pSVar20 = pSVar20 + 1) {
          sVar9 = sf::String::getSize(pSVar20);
          lVar19 = lVar19 + sVar9 + 1;
        }
        uVar15 = 0;
        if (lVar19 != 0) {
          uVar15 = lVar19 - 1;
        }
        Signal<gui::Widget_*,_unsigned_long>::emit(&this->onTextChange,&this->super_Widget,uVar15);
        return true;
      }
      lVar19 = 0;
      local_68.m_string._0_16_ = findCaretPosition(this,0);
      updateCaretPosition(this,(Vector2<unsigned_long> *)&local_68,false);
      pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pSVar20 != pSVar3) {
        lVar19 = 0;
        do {
          sVar9 = sf::String::getSize(pSVar20);
          lVar19 = lVar19 + sVar9 + 1;
          pSVar20 = pSVar20 + 1;
        } while (pSVar20 != pSVar3);
      }
      sVar9 = 0;
      if (lVar19 != 0) {
        sVar9 = lVar19 - 1;
      }
      local_68.m_string._0_16_ = findCaretPosition(this,sVar9);
      continueSelection = true;
      pVVar17 = (Vector2<unsigned_long> *)&local_68;
      goto LAB_00145bdb;
    }
    switch(KVar2) {
    case Left:
      uVar15 = (this->caretPosition_).x;
      if (uVar15 == 0) {
        if (sVar9 == 0) {
          return true;
        }
        sVar9 = sVar9 - 1;
LAB_00145aec:
        updateCaretPosition(this,sVar9,key->shift);
        return true;
      }
      pSVar21 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
      sVar9 = uVar15 - 1;
      if (sVar9 == 0) {
        sVar9 = 0;
        sf::String::operator[](pSVar21,0);
      }
      else {
        bVar6 = false;
        do {
          UVar8 = sf::String::operator[](pSVar21,sVar9);
          bVar7 = true;
          if ((UVar8 == 0x20) && (bVar7 = bVar6, bVar6)) {
            uVar22 = sVar9 + 1;
            goto LAB_00145b89;
          }
          bVar6 = bVar7;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
        uVar22 = 1;
        sVar9 = 0;
LAB_00145b89:
        UVar8 = sf::String::operator[](pSVar21,sVar9);
        if ((UVar8 == 0x20) && (bVar6)) {
          sVar9 = uVar22;
        }
      }
      local_40.y = (this->caretPosition_).y;
      local_40.x = sVar9;
      break;
    case Right:
      uVar22 = (this->caretPosition_).x;
      sVar12 = sf::String::getSize((this->boxStrings_).
                                   super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                   _M_impl.super__Vector_impl_data._M_start +
                                   (this->caretPosition_).y);
      if (sVar12 <= uVar22) {
        pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar19 = 0;
        for (pSVar20 = (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar20 != pSVar3; pSVar20 = pSVar20 + 1) {
          sVar12 = sf::String::getSize(pSVar20);
          lVar19 = lVar19 + sVar12 + 1;
        }
        uVar22 = 0;
        if (lVar19 != 0) {
          uVar22 = lVar19 - 1;
        }
        if (uVar22 <= sVar9) {
          return true;
        }
        sVar9 = sVar9 + 1;
        goto LAB_00145aec;
      }
      uVar22 = (this->caretPosition_).x;
      pSVar21 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
      sVar9 = sf::String::getSize(pSVar21);
      if (uVar22 < sVar9) {
        bVar6 = false;
        do {
          UVar8 = sf::String::operator[](pSVar21,uVar22);
          if ((UVar8 != 0x20) && (bVar6)) break;
          bVar6 = (bool)(bVar6 | UVar8 == 0x20);
          uVar22 = uVar22 + 1;
          sVar9 = sf::String::getSize(pSVar21);
        } while (uVar22 < sVar9);
      }
      local_40.y = (this->caretPosition_).y;
      local_40.x = uVar22;
      break;
    case Up:
      bVar6 = key->shift;
      delta = 1;
      goto LAB_001457da;
    case Down:
      bVar6 = key->shift;
      delta = -1;
LAB_001457da:
      updateScroll(this,true,delta,bVar6);
      goto LAB_00145be0;
    default:
      if (KVar2 != X) {
        return bVar6;
      }
      if ((this->selectionStart_).second != true) {
        return true;
      }
      handleKeyPressed::anon_class_8_1_8991fb9c::operator()
                (&local_68,(anon_class_8_1_8991fb9c *)this);
      sf::Clipboard::setString(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_68.m_string._M_dataplus._M_p != &local_68.m_string.field_2) {
        operator_delete(local_68.m_string._M_dataplus._M_p);
      }
      insertCharacter(this,8,false);
      return true;
    }
LAB_00145bb0:
    sVar9 = findCaretOffset(this,&local_40);
    continueSelection = key->shift;
    goto LAB_00145bc7;
  }
  switch(KVar2) {
  case Enter:
    if (this->maxLines_ == 1) {
      return bVar6;
    }
    bVar7 = insertCharacter(this,10,false);
    if (!bVar7) {
      return bVar6;
    }
    break;
  case BackSpace:
    unicode = 8;
    goto LAB_0014596c;
  case Tab:
    if (this->tabPolicy_ == ignoreTab) {
      return bVar6;
    }
    unicode = 9;
    goto LAB_0014596c;
  case PageUp:
    continueSelection = key->shift;
    sVar9 = 0;
    goto LAB_00145bc7;
  case PageDown:
    pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_finish;
    lVar19 = 0;
    for (pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar20 != pSVar3;
        pSVar20 = pSVar20 + 1) {
      sVar9 = sf::String::getSize(pSVar20);
      lVar19 = lVar19 + sVar9 + 1;
    }
    sVar9 = 0;
    if (lVar19 != 0) {
      sVar9 = lVar19 - 1;
    }
    continueSelection = key->shift;
LAB_00145bc7:
    local_68.m_string._0_16_ = findCaretPosition(this,sVar9);
    pVVar17 = (Vector2<unsigned_long> *)&local_68;
LAB_00145bdb:
    updateCaretPosition(this,pVVar17,(bool)continueSelection);
    break;
  case End:
    local_68.m_string._M_dataplus._M_p =
         (pointer)sf::String::getSize((this->boxStrings_).
                                      super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                                      (this->caretPosition_).y);
    local_68.m_string._M_string_length = (this->caretPosition_).y;
    goto LAB_00145957;
  case Home:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->caretPosition_).y;
    local_68.m_string._0_16_ = auVar5 << 0x40;
LAB_00145957:
    continueSelection = key->shift;
    goto LAB_00145bdb;
  default:
    goto switchD_001455a7_caseD_41;
  case Delete:
    unicode = 0x7f;
LAB_0014596c:
    insertCharacter(this,unicode,false);
    break;
  case Left:
    if (((this->selectionStart_).second == true) && (key->shift == false)) {
      pVVar17 = &(this->selectionStart_).first;
      pVVar1 = &this->selectionEnd_;
      uVar22 = (this->selectionEnd_).y;
      uVar4 = (this->selectionStart_).first.y;
      ppVar14 = (pair<sf::Vector2<unsigned_long>,_bool> *)pVVar1;
      if ((uVar22 <= uVar4) &&
         ((uVar4 != uVar22 ||
          (pVVar1->x <= (((pair<sf::Vector2<unsigned_long>,_bool> *)pVVar17)->first).x)))) {
        ppVar14 = (pair<sf::Vector2<unsigned_long>,_bool> *)pVVar17;
        pVVar17 = pVVar1;
      }
      local_68.m_string._0_16_ = *pVVar17;
      local_68.m_string.field_2._M_allocated_capacity = (ppVar14->first).x;
      local_68.m_string.field_2._8_8_ = (ppVar14->first).y;
LAB_00145c3a:
      continueSelection = false;
      pVVar17 = pVVar16;
      goto LAB_00145bdb;
    }
    if (sVar9 != 0) {
      sVar9 = sVar9 - 1;
LAB_00145a58:
      bVar6 = key->shift;
      goto LAB_00145b0b;
    }
    break;
  case Right:
    if (((this->selectionStart_).second == true) && (key->shift == false)) {
      ppVar14 = &this->selectionStart_;
      pVVar16 = &this->selectionEnd_;
      uVar22 = (this->selectionEnd_).y;
      uVar4 = (this->selectionStart_).first.y;
      if ((uVar4 < uVar22) ||
         ((ppVar13 = ppVar14, uVar4 == uVar22 && ((ppVar14->first).x < pVVar16->x)))) {
        ppVar13 = (pair<sf::Vector2<unsigned_long>,_bool> *)pVVar16;
        pVVar16 = &ppVar14->first;
      }
      local_68.m_string._0_16_ = *pVVar16;
      pVVar16 = (Vector2<unsigned_long> *)&local_68.m_string.field_2;
      local_68.m_string.field_2._M_allocated_capacity = (ppVar13->first).x;
      local_68.m_string.field_2._8_8_ = (ppVar13->first).y;
      goto LAB_00145c3a;
    }
    pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_finish;
    lVar19 = 0;
    for (pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar20 != pSVar3;
        pSVar20 = pSVar20 + 1) {
      sVar12 = sf::String::getSize(pSVar20);
      lVar19 = lVar19 + sVar12 + 1;
    }
    uVar22 = 0;
    if (lVar19 != 0) {
      uVar22 = lVar19 - 1;
    }
    if (sVar9 < uVar22) {
      sVar9 = sVar9 + 1;
      goto LAB_00145a58;
    }
    break;
  case Up:
    local_40.y = (this->caretPosition_).y;
    if (local_40.y != 0) {
      local_40.x = (this->caretPosition_).x;
      local_40.y = local_40.y - 1;
      goto LAB_00145bb0;
    }
    bVar6 = key->shift;
    sVar9 = 0;
    goto LAB_00145b0b;
  case Down:
    uVar22 = (this->caretPosition_).y;
    pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (uVar22 < ((long)pSVar3 - (long)pSVar20 >> 5) - 1U) {
      local_68.m_string._M_string_length = uVar22 + 1;
      local_68.m_string._M_dataplus._M_p = (pointer)(this->caretPosition_).x;
      sVar9 = findCaretOffset(this,(Vector2<unsigned_long> *)&local_68);
      bVar6 = key->shift;
    }
    else {
      lVar19 = 0;
      for (; pSVar20 != pSVar3; pSVar20 = pSVar20 + 1) {
        sVar9 = sf::String::getSize(pSVar20);
        lVar19 = lVar19 + sVar9 + 1;
      }
      sVar9 = 0;
      if (lVar19 != 0) {
        sVar9 = lVar19 - 1;
      }
      bVar6 = key->shift;
    }
LAB_00145b0b:
    updateCaretPosition(this,sVar9,bVar6);
  }
LAB_00145be0:
  bVar6 = true;
switchD_001455a7_caseD_41:
  return bVar6;
}

Assistant:

bool MultilineTextBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    size_t caretOffset = findCaretOffset(caretPosition_);

    auto getSelectedText = [this]() -> sf::String {
        sf::String selectedText = "";
        auto selection = sortByYFirst(selectionStart_.first, selectionEnd_);
        for (size_t y = selection.first.y; y <= selection.second.y; ++y) {
            if (y == selection.first.y) {
                if (y == selection.second.y) {
                    selectedText += boxStrings_[y].substring(selection.first.x, selection.second.x - selection.first.x);
                } else {
                    selectedText += boxStrings_[y].substring(selection.first.x);
                }
            } else if (y > selection.first.y && y < selection.second.y) {
                selectedText += "\n" + boxStrings_[y];
            } else if (y == selection.second.y) {
                selectedText += "\n" + boxStrings_[y].substring(0, selection.second.x);
            }
        }
        GUI_DEBUG << "selectedText = [" << selectedText.toAnsiString() << "]\n";
        return selectedText;
    };

    if (key.control) {
        if (key.code == sf::Keyboard::Up) {
            updateScroll(true, 1, key.shift);
        } else if (key.code == sf::Keyboard::Down) {
            updateScroll(true, -1, key.shift);
        } else if (key.code == sf::Keyboard::Left) {
            if (caretPosition_.x > 0) {
                bool foundNonSpace = false;
                const sf::String& line = boxStrings_[caretPosition_.y];
                size_t i = caretPosition_.x - 1;
                while (i > 0) {
                    if (line[i] != ' ') {
                        foundNonSpace = true;
                    } else if (foundNonSpace) {
                        break;
                    }
                    --i;
                }
                updateCaretPosition(findCaretOffset({(line[i] == ' ' && foundNonSpace ? i + 1 : i), caretPosition_.y}), key.shift);
            } else if (caretOffset > 0) {
                updateCaretPosition(caretOffset - 1, key.shift);
            }
        } else if (key.code == sf::Keyboard::Right) {
            if (caretPosition_.x < boxStrings_[caretPosition_.y].getSize()) {
                bool foundSpace = false;
                const sf::String& line = boxStrings_[caretPosition_.y];
                size_t i = caretPosition_.x;
                while (i < line.getSize()) {
                    if (line[i] == ' ') {
                        foundSpace = true;
                    } else if (foundSpace) {
                        break;
                    }
                    ++i;
                }
                updateCaretPosition(findCaretOffset({i, caretPosition_.y}), key.shift);
            } else if (caretOffset < findStringsLength(boxStrings_)) {
                updateCaretPosition(caretOffset + 1, key.shift);
            }
        } else if (key.code == sf::Keyboard::A) {
            updateCaretPosition(0, false);
            updateCaretPosition(findStringsLength(boxStrings_), true);
        } else if (key.code == sf::Keyboard::X) {
            if (selectionStart_.second) {
                sf::Clipboard::setString(getSelectedText());
                insertCharacter('\u0008');
            }
        } else if (key.code == sf::Keyboard::C) {
            if (selectionStart_.second) {
                sf::Clipboard::setString(getSelectedText());
            }
        } else if (key.code == sf::Keyboard::V) {
            bool textChanged = false;
            for (auto c : sf::Clipboard::getString()) {
                textChanged = insertCharacter(c, true) || textChanged;
            }
            if (textChanged) {
                onTextChange.emit(this, findStringsLength(boxStrings_));
            }
        } else {
            return eventConsumed;
        }
        return true;
    }

    if (key.code == sf::Keyboard::Enter) {
        if (maxLines_ == 1 || !insertCharacter('\u000a')) {
            return eventConsumed;
        }
    } else if (key.code == sf::Keyboard::Backspace) {
        insertCharacter('\u0008');
    } else if (key.code == sf::Keyboard::Tab) {
        if (tabPolicy_ == TabPolicy::ignoreTab) {
            return eventConsumed;
        }
        insertCharacter('\u0009');
    } else if (key.code == sf::Keyboard::Delete) {
        insertCharacter('\u007f');
    } else if (key.code == sf::Keyboard::PageUp) {
        updateCaretPosition(0, key.shift);
    } else if (key.code == sf::Keyboard::PageDown) {
        updateCaretPosition(findStringsLength(boxStrings_), key.shift);
    } else if (key.code == sf::Keyboard::Home) {
        updateCaretPosition({0, caretPosition_.y}, key.shift);
    } else if (key.code == sf::Keyboard::End) {
        updateCaretPosition({boxStrings_[caretPosition_.y].getSize(), caretPosition_.y}, key.shift);
    } else if (key.code == sf::Keyboard::Up) {
        if (caretPosition_.y > 0) {
            updateCaretPosition(findCaretOffset({caretPosition_.x, caretPosition_.y - 1}), key.shift);
        } else {
            updateCaretPosition(0, key.shift);
        }
    } else if (key.code == sf::Keyboard::Down) {
        if (caretPosition_.y < boxStrings_.size() - 1) {
            updateCaretPosition(findCaretOffset({caretPosition_.x, caretPosition_.y + 1}), key.shift);
        } else {
            updateCaretPosition(findStringsLength(boxStrings_), key.shift);
        }
    } else if (key.code == sf::Keyboard::Left) {
        if (selectionStart_.second && !key.shift) {
            updateCaretPosition(sortByYFirst(selectionStart_.first, selectionEnd_).first, false);
        } else if (caretOffset > 0) {
            updateCaretPosition(caretOffset - 1, key.shift);
        }
    } else if (key.code == sf::Keyboard::Right) {
        if (selectionStart_.second && !key.shift) {
            updateCaretPosition(sortByYFirst(selectionStart_.first, selectionEnd_).second, false);
        } else if (caretOffset < findStringsLength(boxStrings_)) {
            updateCaretPosition(caretOffset + 1, key.shift);
        }
    } else {
        return eventConsumed;
    }
    return true;
}